

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

_Bool cs_disasm_iter(csh ud,uint8_t **code,size_t *size,uint64_t *address,cs_insn *insn)

{
  _Bool _Var1;
  uint64_t *in_RCX;
  size_t *in_RDX;
  long *in_RSI;
  cs_struct *in_RDI;
  cs_insn *in_R8;
  size_t skipdata_bytes;
  SStream ss;
  _Bool r;
  MCInst mci;
  uint16_t insn_size;
  cs_struct *handle;
  size_t local_5b0;
  size_t in_stack_fffffffffffffa60;
  uint8_t *in_stack_fffffffffffffa68;
  char *in_stack_fffffffffffffa70;
  uint8_t *in_stack_fffffffffffffa78;
  PostPrinter_t in_stack_fffffffffffffa80;
  MCInst *in_stack_fffffffffffffa88;
  char *in_stack_fffffffffffffa90;
  cs_insn *in_stack_fffffffffffffa98;
  cs_struct *in_stack_fffffffffffffaa0;
  MCInst local_3a0;
  ushort local_3a;
  cs_struct *local_38;
  cs_insn *local_30;
  uint64_t *local_28;
  size_t *local_20;
  long *local_18;
  cs_struct *local_10;
  
  if (in_RDI == (cs_struct *)0x0) {
    return false;
  }
  in_RDI->errnum = CS_ERR_OK;
  local_38 = in_RDI;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  MCInst_Init(&local_3a0);
  local_3a0.csh = local_38;
  local_3a0.address = *local_28;
  local_3a0.flat_insn = local_30;
  local_30->address = *local_28;
  _Var1 = (*local_38->disasm)((csh)local_10,(uint8_t *)*local_18,*local_20,&local_3a0,&local_3a,
                              *local_28,local_38->getinsn_info);
  if (_Var1) {
    SStream_Init((SStream *)&stack0xfffffffffffffa58);
    (local_3a0.flat_insn)->size = local_3a;
    (*local_38->insn_id)(local_38,local_30,local_3a0.Opcode);
    (*local_38->printer)(&local_3a0,(SStream *)&stack0xfffffffffffffa58,local_38->printer_info);
    fill_insn(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
              in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    if (local_38->arch == CS_ARCH_X86) {
      local_30->id = (uint)local_3a0.popcode_adjust + local_30->id;
    }
    *local_18 = *local_18 + (long)(int)(uint)local_3a;
    *local_20 = *local_20 - (ulong)local_3a;
    *local_28 = (ulong)local_3a + *local_28;
  }
  else {
    if (((local_38->skipdata & 1U) == 0) || (*local_20 < (ulong)local_38->skipdata_size)) {
      return false;
    }
    if ((local_38->skipdata_setup).callback == (cs_skipdata_cb_t)0x0) {
      local_5b0 = (size_t)local_38->skipdata_size;
    }
    else {
      local_5b0 = (*(local_38->skipdata_setup).callback)
                            ((uint8_t *)*local_18,*local_20,0,(local_38->skipdata_setup).user_data);
      if (*local_20 < local_5b0) {
        return false;
      }
      if (local_5b0 == 0) {
        return false;
      }
    }
    local_30->id = 0;
    local_30->address = *local_28;
    local_30->size = (uint16_t)local_5b0;
    memcpy(local_30->bytes,(void *)*local_18,local_5b0);
    strncpy(local_30->mnemonic,(local_38->skipdata_setup).mnemonic,0x1f);
    skipdata_opstr(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
    *local_18 = local_5b0 + *local_18;
    *local_20 = *local_20 - local_5b0;
    *local_28 = local_5b0 + *local_28;
  }
  return true;
}

Assistant:

CAPSTONE_API cs_disasm_iter(csh ud, const uint8_t **code, size_t *size,
		uint64_t *address, cs_insn *insn)
{
	struct cs_struct *handle;
	uint16_t insn_size;
	MCInst mci;
	bool r;

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle) {
		return false;
	}

	handle->errnum = CS_ERR_OK;

	MCInst_Init(&mci);
	mci.csh = handle;

	// relative branches need to know the address & size of current insn
	mci.address = *address;

	// save all the information for non-detailed mode
	mci.flat_insn = insn;
	mci.flat_insn->address = *address;
#ifdef CAPSTONE_DIET
	// zero out mnemonic & op_str
	mci.flat_insn->mnemonic[0] = '\0';
	mci.flat_insn->op_str[0] = '\0';
#endif

	r = handle->disasm(ud, *code, *size, &mci, &insn_size, *address, handle->getinsn_info);
	if (r) {
		SStream ss;
		SStream_Init(&ss);

		mci.flat_insn->size = insn_size;

		// map internal instruction opcode to public insn ID
		handle->insn_id(handle, insn, mci.Opcode);

		handle->printer(&mci, &ss, handle->printer_info);

		fill_insn(handle, insn, ss.buffer, &mci, handle->post_printer, *code);

		// adjust for pseudo opcode (X86)
		if (handle->arch == CS_ARCH_X86)
			insn->id += mci.popcode_adjust;

		*code += insn_size;
		*size -= insn_size;
		*address += insn_size;
	} else { 	// encounter a broken instruction
		size_t skipdata_bytes;

		// if there is no request to skip data, or remaining data is too small,
		// then bail out
		if (!handle->skipdata || handle->skipdata_size > *size)
			return false;

		if (handle->skipdata_setup.callback) {
			skipdata_bytes = handle->skipdata_setup.callback(*code, *size,
					0, handle->skipdata_setup.user_data);
			if (skipdata_bytes > *size)
				// remaining data is not enough
				return false;

			if (!skipdata_bytes)
				// user requested not to skip data, so bail out
				return false;
		} else
			skipdata_bytes = handle->skipdata_size;

		// we have to skip some amount of data, depending on arch & mode
		insn->id = 0;	// invalid ID for this "data" instruction
		insn->address = *address;
		insn->size = (uint16_t)skipdata_bytes;
#ifdef CAPSTONE_DIET
		insn->mnemonic[0] = '\0';
		insn->op_str[0] = '\0';
#else
		memcpy(insn->bytes, *code, skipdata_bytes);
		strncpy(insn->mnemonic, handle->skipdata_setup.mnemonic,
				sizeof(insn->mnemonic) - 1);
		skipdata_opstr(insn->op_str, *code, skipdata_bytes);
#endif

		*code += skipdata_bytes;
		*size -= skipdata_bytes;
		*address += skipdata_bytes;
	}

	return true;
}